

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bernstein_polynomial.cpp
# Opt level: O2

double * bernstein_poly_ab_approx(int n,double a,double b,double *ydata,int nval,double *xval)

{
  double *pdVar1;
  double *a2;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  uVar4 = 0;
  uVar3 = 0xffffffffffffffff;
  if (-1 < nval) {
    uVar3 = (ulong)(uint)nval << 3;
  }
  uVar2 = (ulong)(uint)nval;
  if (nval < 1) {
    uVar2 = uVar4;
  }
  pdVar1 = (double *)operator_new__(uVar3);
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    a2 = bernstein_poly_ab(n,a,b,xval[uVar4]);
    dVar5 = r8vec_dot_product(n + 1,ydata,a2);
    pdVar1[uVar4] = dVar5;
    operator_delete__(a2);
  }
  return pdVar1;
}

Assistant:

double *bernstein_poly_ab_approx ( int n, double a, double b, double ydata[], 
  int nval, double xval[] )

//****************************************************************************80
//
//  Purpose:
//
//    BERNSTEIN_POLY_AB_APPROX: Bernstein approximant to F(X) on [A,B].
//
//  Formula:
//
//    BPAB(F)(X) = sum ( 0 <= I <= N ) F(X(I)) * B_BASE(I,X)
//
//    where
//
//      X(I) = ( ( N - I ) * A + I * B ) / N
//      B_BASE(I,X) is the value of the I-th Bernstein basis polynomial at X.
//
//  Discussion:
//
//    The Bernstein polynomial BPAB(F) for F(X) over [A,B] is an approximant, 
//    not an interpolant; in other words, its value is not guaranteed to equal
//    that of F at any particular point.  However, for a fixed interval
//    [A,B], if we let N increase, the Bernstein polynomial converges
//    uniformly to F everywhere in [A,B], provided only that F is continuous.
//    Even if F is not continuous, but is bounded, the polynomial converges
//    pointwise to F(X) at all points of continuity.  On the other hand,
//    the convergence is quite slow compared to other interpolation
//    and approximation schemes.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    29 July 2011
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    David Kahaner, Cleve Moler, Steven Nash,
//    Numerical Methods and Software,
//    Prentice Hall, 1989,
//    ISBN: 0-13-627258-4,
//    LC: TA345.K34.
//
//  Parameters:
//
//    Input, int N, the degree of the Bernstein polynomial
//    to be used.  N must be at least 0.
//
//    Input, double A, B, the endpoints of the interval on which the
//    approximant is based.  A and B should not be equal.
//
//    Input, double YDATA[N+1], the data values at N+1 equally
//    spaced points in [A,B].  If N = 0, then the evaluation point should
//    be 0.5 * ( A + B).  Otherwise, evaluation point I should be
//    ( (N-I)*A + I*B ) / N ).
//
//    Input, int NVAL, the number of points at which the
//    approximant is to be evaluated.
//
//    Input, double XVAL[NVAL], the point at which the Bernstein 
//    polynomial approximant is to be evaluated.  The entries of XVAL do not 
//    have to lie in the interval [A,B].
//
//    Output, double BPAB_APPROX[NVAL], the values of the Bernstein 
//    polynomial approximant for F, based in [A,B], evaluated at XVAL.
//
{
  double *bvec;
  int i;
  double *yval;

  yval = new double[nval];

  for ( i = 0; i < nval; i++ )
  {
//
//  Evaluate the Bernstein basis polynomials at XVAL.
//
    bvec = bernstein_poly_ab ( n, a, b, xval[i] );
//
//  Now compute the sum of YDATA(I) * BVEC(I).
//
    yval[i] = r8vec_dot_product ( n + 1, ydata, bvec );

    delete [] bvec;
  }

  return yval;
}